

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerMovepage(Pager *pPager,DbPage *pPg,Pgno pgno,int isCommit)

{
  int iVar1;
  PgHdr *local_48;
  PgHdr *pPgHdr;
  int local_38;
  Pgno origPgno;
  int rc;
  Pgno needSyncPgno;
  PgHdr *pPgOld;
  int isCommit_local;
  Pgno pgno_local;
  DbPage *pPg_local;
  Pager *pPager_local;
  
  origPgno = 0;
  pPgOld._0_4_ = isCommit;
  pPgOld._4_4_ = pgno;
  _isCommit_local = pPg;
  pPg_local = (DbPage *)pPager;
  if (pPager->tempFile != '\0') {
    iVar1 = sqlite3PagerWrite(pPg);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_38 = 0;
  }
  if (((_isCommit_local->flags & 2) == 0) ||
     (local_38 = subjournalPageIfRequired(_isCommit_local), pPager_local._4_4_ = local_38,
     local_38 == 0)) {
    if (((_isCommit_local->flags & 8) != 0) && ((int)pPgOld == 0)) {
      origPgno = _isCommit_local->pgno;
    }
    _isCommit_local->flags = _isCommit_local->flags & 0xfff7;
    _rc = sqlite3PagerLookup((Pager *)pPg_local,pPgOld._4_4_);
    if (_rc != (DbPage *)0x0) {
      if (1 < _rc->nRef) {
        sqlite3PagerUnrefNotNull(_rc);
        iVar1 = sqlite3CorruptError(0xee81);
        return iVar1;
      }
      _isCommit_local->flags = _isCommit_local->flags | _rc->flags & 8;
      if (*(char *)&pPg_local->pExtra == '\0') {
        sqlite3PcacheDrop(_rc);
      }
      else {
        sqlite3PcacheMove(_rc,*(int *)&pPg_local->pDirty + 1);
      }
    }
    pPgHdr._4_4_ = _isCommit_local->pgno;
    sqlite3PcacheMove(_isCommit_local,pPgOld._4_4_);
    sqlite3PcacheMakeDirty(_isCommit_local);
    if ((*(char *)&pPg_local->pExtra != '\0') && (_rc != (PgHdr *)0x0)) {
      sqlite3PcacheMove(_rc,pPgHdr._4_4_);
      sqlite3PagerUnrefNotNull(_rc);
    }
    if (origPgno != 0) {
      local_38 = sqlite3PagerGet((Pager *)pPg_local,origPgno,&local_48,0);
      if (local_38 != 0) {
        if (origPgno <= *(uint *)((long)&pPg_local->pDirty + 4)) {
          sqlite3BitvecClear((Bitvec *)pPg_local->pDirtyPrev,origPgno,pPg_local[3].pDirtyPrev);
        }
        return local_38;
      }
      local_48->flags = local_48->flags | 8;
      sqlite3PcacheMakeDirty(local_48);
      sqlite3PagerUnrefNotNull(local_48);
    }
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerMovepage(Pager *pPager, DbPage *pPg, Pgno pgno, int isCommit){
  PgHdr *pPgOld;               /* The page being overwritten. */
  Pgno needSyncPgno = 0;       /* Old value of pPg->pgno, if sync is required */
  int rc;                      /* Return code */
  Pgno origPgno;               /* The original page number */

  assert( pPg->nRef>0 );
  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* In order to be able to rollback, an in-memory database must journal
  ** the page we are moving from.
  */
  assert( pPager->tempFile || !MEMDB );
  if( pPager->tempFile ){
    rc = sqlite3PagerWrite(pPg);
    if( rc ) return rc;
  }

  /* If the page being moved is dirty and has not been saved by the latest
  ** savepoint, then save the current contents of the page into the
  ** sub-journal now. This is required to handle the following scenario:
  **
  **   BEGIN;
  **     <journal page X, then modify it in memory>
  **     SAVEPOINT one;
  **       <Move page X to location Y>
  **     ROLLBACK TO one;
  **
  ** If page X were not written to the sub-journal here, it would not
  ** be possible to restore its contents when the "ROLLBACK TO one"
  ** statement were is processed.
  **
  ** subjournalPage() may need to allocate space to store pPg->pgno into
  ** one or more savepoint bitvecs. This is the reason this function
  ** may return SQLITE_NOMEM.
  */
  if( (pPg->flags & PGHDR_DIRTY)!=0
   && SQLITE_OK!=(rc = subjournalPageIfRequired(pPg))
  ){
    return rc;
  }

  PAGERTRACE(("MOVE %d page %d (needSync=%d) moves to %d\n",
      PAGERID(pPager), pPg->pgno, (pPg->flags&PGHDR_NEED_SYNC)?1:0, pgno));
  IOTRACE(("MOVE %p %d %d\n", pPager, pPg->pgno, pgno))

  /* If the journal needs to be sync()ed before page pPg->pgno can
  ** be written to, store pPg->pgno in local variable needSyncPgno.
  **
  ** If the isCommit flag is set, there is no need to remember that
  ** the journal needs to be sync()ed before database page pPg->pgno
  ** can be written to. The caller has already promised not to write to it.
  */
  if( (pPg->flags&PGHDR_NEED_SYNC) && !isCommit ){
    needSyncPgno = pPg->pgno;
    assert( pPager->journalMode==PAGER_JOURNALMODE_OFF ||
            pageInJournal(pPager, pPg) || pPg->pgno>pPager->dbOrigSize );
    assert( pPg->flags&PGHDR_DIRTY );
  }

  /* If the cache contains a page with page-number pgno, remove it
  ** from its hash chain. Also, if the PGHDR_NEED_SYNC flag was set for
  ** page pgno before the 'move' operation, it needs to be retained
  ** for the page moved there.
  */
  pPg->flags &= ~PGHDR_NEED_SYNC;
  pPgOld = sqlite3PagerLookup(pPager, pgno);
  assert( !pPgOld || pPgOld->nRef==1 || CORRUPT_DB );
  if( pPgOld ){
    if( NEVER(pPgOld->nRef>1) ){
      sqlite3PagerUnrefNotNull(pPgOld);
      return SQLITE_CORRUPT_BKPT;
    }
    pPg->flags |= (pPgOld->flags&PGHDR_NEED_SYNC);
    if( pPager->tempFile ){
      /* Do not discard pages from an in-memory database since we might
      ** need to rollback later.  Just move the page out of the way. */
      sqlite3PcacheMove(pPgOld, pPager->dbSize+1);
    }else{
      sqlite3PcacheDrop(pPgOld);
    }
  }

  origPgno = pPg->pgno;
  sqlite3PcacheMove(pPg, pgno);
  sqlite3PcacheMakeDirty(pPg);

  /* For an in-memory database, make sure the original page continues
  ** to exist, in case the transaction needs to roll back.  Use pPgOld
  ** as the original page since it has already been allocated.
  */
  if( pPager->tempFile && pPgOld ){
    sqlite3PcacheMove(pPgOld, origPgno);
    sqlite3PagerUnrefNotNull(pPgOld);
  }

  if( needSyncPgno ){
    /* If needSyncPgno is non-zero, then the journal file needs to be
    ** sync()ed before any data is written to database file page needSyncPgno.
    ** Currently, no such page exists in the page-cache and the
    ** "is journaled" bitvec flag has been set. This needs to be remedied by
    ** loading the page into the pager-cache and setting the PGHDR_NEED_SYNC
    ** flag.
    **
    ** If the attempt to load the page into the page-cache fails, (due
    ** to a malloc() or IO failure), clear the bit in the pInJournal[]
    ** array. Otherwise, if the page is loaded and written again in
    ** this transaction, it may be written to the database file before
    ** it is synced into the journal file. This way, it may end up in
    ** the journal file twice, but that is not a problem.
    */
    PgHdr *pPgHdr;
    rc = sqlite3PagerGet(pPager, needSyncPgno, &pPgHdr, 0);
    if( rc!=SQLITE_OK ){
      if( needSyncPgno<=pPager->dbOrigSize ){
        assert( pPager->pTmpSpace!=0 );
        sqlite3BitvecClear(pPager->pInJournal, needSyncPgno, pPager->pTmpSpace);
      }
      return rc;
    }
    pPgHdr->flags |= PGHDR_NEED_SYNC;
    sqlite3PcacheMakeDirty(pPgHdr);
    sqlite3PagerUnrefNotNull(pPgHdr);
  }

  return SQLITE_OK;
}